

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_named_unary_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos666;
  int yypos666;
  int yythunkpos664;
  int yypos664;
  int yythunkpos662;
  int yypos662;
  int yythunkpos658;
  int yypos658;
  int yythunkpos657;
  int yypos657;
  int yythunkpos654;
  int yypos654;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  yyDo(G,yy_1_named_unary_expr,G->begin,G->end,"yy_1_named_unary_expr");
  iVar5 = yymatchString(G,"my");
  if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
    do {
      iVar5 = G->pos;
      iVar4 = G->thunkpos;
      iVar6 = yy_ws(G);
    } while (iVar6 != 0);
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yy_ident(G);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
    }
    else {
      yyDo(G,yySet,-3,0,"yySet");
    }
    iVar5 = yy__(G);
    if ((iVar5 != 0) && (iVar5 = yy_junctive_or_expr(G), iVar5 != 0)) {
      yyDo(G,yySet,-2,0,"yySet");
      yyDo(G,yy_2_named_unary_expr,G->begin,G->end,"yy_2_named_unary_expr");
      goto LAB_0011d791;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"our");
  if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
    do {
      iVar5 = G->pos;
      iVar4 = G->thunkpos;
      iVar6 = yy_ws(G);
    } while (iVar6 != 0);
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar5 = yy_junctive_or_expr(G);
    if (iVar5 != 0) {
      yyDo(G,yySet,-2,0,"yySet");
      yyDo(G,yy_3_named_unary_expr,G->begin,G->end,"yy_3_named_unary_expr");
      goto LAB_0011d791;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = G->pos;
  iVar4 = G->thunkpos;
  iVar6 = yy_reserved(G);
  if (iVar6 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar5 = yy_ident(G);
    if (iVar5 != 0) {
      yyDo(G,yySet,-1,0,"yySet");
      iVar5 = yy_ws(G);
      if (iVar5 != 0) {
        do {
          iVar5 = G->pos;
          iVar4 = G->thunkpos;
          iVar6 = yy_ws(G);
        } while (iVar6 != 0);
        G->pos = iVar5;
        G->thunkpos = iVar4;
        iVar5 = yy_bare_args(G);
        if (iVar5 != 0) {
          yyDo(G,yySet,-2,0,"yySet");
          yyDo(G,yy_4_named_unary_expr,G->begin,G->end,"yy_4_named_unary_expr");
          goto LAB_0011d791;
        }
      }
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar7 = yy_junctive_or_expr(G);
  if (iVar7 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    return 0;
  }
LAB_0011d791:
  yyDo(G,yyPop,3,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_named_unary_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "named_unary_expr"));

  {  int yypos654= G->pos, yythunkpos654= G->thunkpos;  yyDo(G, yy_1_named_unary_expr, G->begin, G->end, "yy_1_named_unary_expr");
  if (!yymatchString(G, "my")) goto l655;
  if (!yy_ws(G))  goto l655;

  l656:;	
  {  int yypos657= G->pos, yythunkpos657= G->thunkpos;  if (!yy_ws(G))  goto l657;
  goto l656;
  l657:;	  G->pos= yypos657; G->thunkpos= yythunkpos657;
  }
  {  int yypos658= G->pos, yythunkpos658= G->thunkpos;  if (!yy_ident(G))  goto l658;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l659;
  l658:;	  G->pos= yypos658; G->thunkpos= yythunkpos658;
  }
  l659:;	  if (!yy__(G))  goto l655;
  if (!yy_junctive_or_expr(G))  goto l655;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_2_named_unary_expr, G->begin, G->end, "yy_2_named_unary_expr");
  goto l654;
  l655:;	  G->pos= yypos654; G->thunkpos= yythunkpos654;  if (!yymatchString(G, "our")) goto l660;
  if (!yy_ws(G))  goto l660;

  l661:;	
  {  int yypos662= G->pos, yythunkpos662= G->thunkpos;  if (!yy_ws(G))  goto l662;
  goto l661;
  l662:;	  G->pos= yypos662; G->thunkpos= yythunkpos662;
  }  if (!yy_junctive_or_expr(G))  goto l660;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_3_named_unary_expr, G->begin, G->end, "yy_3_named_unary_expr");
  goto l654;
  l660:;	  G->pos= yypos654; G->thunkpos= yythunkpos654;
  {  int yypos664= G->pos, yythunkpos664= G->thunkpos;  if (!yy_reserved(G))  goto l664;
  goto l663;
  l664:;	  G->pos= yypos664; G->thunkpos= yythunkpos664;
  }  if (!yy_ident(G))  goto l663;
  yyDo(G, yySet, -1, 0, "yySet");
  if (!yy_ws(G))  goto l663;

  l665:;	
  {  int yypos666= G->pos, yythunkpos666= G->thunkpos;  if (!yy_ws(G))  goto l666;
  goto l665;
  l666:;	  G->pos= yypos666; G->thunkpos= yythunkpos666;
  }  if (!yy_bare_args(G))  goto l663;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_4_named_unary_expr, G->begin, G->end, "yy_4_named_unary_expr");
  goto l654;
  l663:;	  G->pos= yypos654; G->thunkpos= yythunkpos654;  if (!yy_junctive_or_expr(G))  goto l653;

  }
  l654:;	  yyprintf((stderr, "  ok   named_unary_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l653:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "named_unary_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}